

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

uint64_t pmevtyper_readfn(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  uint uVar1;
  uint64_t *puVar2;
  
  uVar1 = (ri->opc2 & 7) + (ri->crm & 3) * 8;
  if (uVar1 == 0x1f) {
    puVar2 = &(env->cp15).pmccfiltr_el0;
  }
  else {
    if (((uint)(env->cp15).c9_pmcr >> 0xb & 0x1f) <= uVar1) {
      return 0;
    }
    puVar2 = (env->cp15).c14_pmevtyper + (byte)uVar1;
  }
  return *puVar2;
}

Assistant:

static uint64_t pmevtyper_readfn(CPUARMState *env, const ARMCPRegInfo *ri)
{
    uint8_t counter = ((ri->crm & 3) << 3) | (ri->opc2 & 7);
    return pmevtyper_read(env, ri, counter);
}